

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

void __thiscall
uWS::Group<true>::Group(Group<true> *this,int extensionOptions,Hub *hub,NodeData *nodeData)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode)> *this_00;
  function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)> *__x;
  function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode)> *this_01;
  NodeData *in_stack_ffffffffffffff98;
  NodeData *in_stack_ffffffffffffffa0;
  
  uS::NodeData::NodeData(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode)> *)
            (in_RDI + 0x80);
  std::function<void_(uWS::WebSocket<true>,_uWS::UpgradeInfo)>::function
            ((function<void_(uWS::WebSocket<true>,_uWS::UpgradeInfo)> *)this_00);
  std::function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode)>::function(this_00);
  std::function<void_(uWS::WebSocket<true>,_int,_char_*,_unsigned_long)>::function
            ((function<void_(uWS::WebSocket<true>,_int,_char_*,_unsigned_long)> *)this_00);
  __x = (function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)> *)(in_RDI + 0xe0);
  std::function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)>::function
            ((function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)> *)this_00);
  this_01 = (function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode)> *)
            (in_RDI + 0x100);
  std::function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)>::function
            ((function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)> *)this_00);
  std::function<void_(int)>::function((function<void_(int)> *)this_00);
  *(undefined8 *)(in_RDI + 0x140) = in_RDX;
  *(undefined4 *)(in_RDI + 0x148) = in_ESI;
  *(undefined8 *)(in_RDI + 0x150) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x158));
  *(undefined8 *)(in_RDI + 0x178) = 0;
  *(undefined8 *)(in_RDI + 0x180) = 0;
  *(undefined8 *)(in_RDI + 0x188) = 0;
  std::stack<uv_poll_s*,std::deque<uv_poll_s*,std::allocator<uv_poll_s*>>>::
  stack<std::deque<uv_poll_s*,std::allocator<uv_poll_s*>>,void>
            ((stack<uv_poll_s_*,_std::deque<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>_> *)this_00);
  std::function<void(uWS::WebSocket<true>,uWS::UpgradeInfo)>::operator=
            ((function<void_(uWS::WebSocket<true>,_uWS::UpgradeInfo)> *)this_01,
             (anon_class_1_0_00000001 *)__x);
  std::function<void(uWS::WebSocket<true>,char*,unsigned_long,uWS::OpCode)>::operator=
            (this_01,(anon_class_1_0_00000001 *)__x);
  std::function<void(uWS::WebSocket<true>,int,char*,unsigned_long)>::operator=
            ((function<void_(uWS::WebSocket<true>,_int,_char_*,_unsigned_long)> *)this_01,
             (anon_class_1_0_00000001 *)__x);
  std::function<void(uWS::WebSocket<true>,char*,unsigned_long)>::operator=
            ((function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)> *)this_01,
             (anon_class_1_0_00000001 *)__x);
  std::function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)>::operator=
            ((function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)> *)this_01,__x);
  std::function<void(int)>::operator=
            ((function<void_(int)> *)this_01,(anon_class_1_0_00000001 *)__x);
  *(uint *)(in_RDI + 0x148) = *(uint *)(in_RDI + 0x148) | 6;
  return;
}

Assistant:

Group<isServer>::Group(int extensionOptions, Hub *hub, uS::NodeData *nodeData) : uS::NodeData(*nodeData), hub(hub), extensionOptions(extensionOptions) {
    connectionHandler = [](WebSocket<isServer>, UpgradeInfo) {};
    messageHandler = [](WebSocket<isServer>, char *, size_t, OpCode) {};
    disconnectionHandler = [](WebSocket<isServer>, int, char *, size_t) {};
    pingHandler = pongHandler = [](WebSocket<isServer>, char *, size_t) {};
    errorHandler = [](errorType) {};

    this->extensionOptions |= CLIENT_NO_CONTEXT_TAKEOVER | SERVER_NO_CONTEXT_TAKEOVER;
}